

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

void __thiscall NodeList::add_node(NodeList *this,GridNode *node)

{
  int iVar1;
  GridNode **ppGVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  void *unaff_R15;
  
  iVar1 = this->count;
  lVar6 = (long)iVar1;
  this->count = iVar1 + 1;
  if (this->capacity == iVar1) {
    iVar4 = (int)((float)iVar1 * 1.5);
    if (iVar1 < 4) {
      iVar4 = iVar1 + 1;
    }
    this->capacity = iVar4;
    if (0 < iVar1) {
      unaff_R15 = operator_new__(lVar6 * 8);
      memcpy(unaff_R15,this->list,lVar6 * 8);
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar5 = (long)iVar4 << 3;
    }
    ppGVar2 = (GridNode **)operator_new__(uVar5);
    this->list = ppGVar2;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        this->list[lVar3] = *(GridNode **)((long)unaff_R15 + lVar3 * 8);
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
  }
  this->list[lVar6] = node;
  return;
}

Assistant:

void add_node(GridNode *node)
    {
        count++;
        if (capacity == count - 1)
        {
            capacity = (capacity <= 3) ? (capacity + 1) : ((int)(capacity * 1.5f));
            GridNode **tempList;
            if (count > 1)
            {
                tempList = new GridNode *[count - 1];
                for (int i = 0; i < count - 1; i++)
                {
                    tempList[i] = list[i];
                }
            }
            list = new GridNode *[capacity];
            for (int i = 0; i < count - 1; i++)
            {
                list[i] = tempList[i];
            }
        }
        list[count - 1] = node;
    }